

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O0

void window_close_callback(GLFWwindow *window)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  char *pcVar4;
  Slot *slot;
  GLFWwindow *window_local;
  
  pvVar3 = glfwGetWindowUserPointer(window);
  uVar2 = counter;
  counter = counter + 1;
  uVar1 = *(uint *)((long)pvVar3 + 8);
  glfwGetTime();
  printf("%08x to %i at %0.3f: Window close\n",(ulong)uVar2,(ulong)uVar1);
  if (*(int *)((long)pvVar3 + 0xc) == 0) {
    pcVar4 = glfwGetKeyName(0x43,0);
    printf("(( closing is disabled, press %s to re-enable )\n",pcVar4);
  }
  glfwSetWindowShouldClose(window,*(int *)((long)pvVar3 + 0xc));
  return;
}

Assistant:

static void window_close_callback(GLFWwindow* window)
{
    Slot* slot = glfwGetWindowUserPointer(window);
    printf("%08x to %i at %0.3f: Window close\n",
           counter++, slot->number, glfwGetTime());

    if (!slot->closeable)
    {
        printf("(( closing is disabled, press %s to re-enable )\n",
               glfwGetKeyName(GLFW_KEY_C, 0));
    }

    glfwSetWindowShouldClose(window, slot->closeable);
}